

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O0

uint64_t fio_risky_hash(void *data_,size_t len,uint64_t seed)

{
  uint uVar1;
  ulong uVar3;
  uint64_t result;
  uint64_t tmp;
  size_t i;
  uint64_t v3;
  uint64_t v2;
  uint64_t v1;
  uint64_t v0;
  uint8_t *data;
  uint64_t seed_local;
  size_t len_local;
  void *data__local;
  uint uVar2;
  
  v1 = seed ^ 0xab137439982b86c9;
  v2 = (seed ^ 0xffffffffffffffff) + 0xab137439982b86c9;
  v3 = (seed << 0x11 | seed >> 0x2f) ^ 0x50a6cb67c2f68a71;
  i = (seed << 0x21 | seed >> 0x1f) + 0x54ec8bc667d47936;
  v0 = (uint64_t)data_;
  for (tmp = len >> 5; tmp != 0; tmp = tmp - 1) {
    uVar3 = ((ulong)*(byte *)v0 << 0x38 | (ulong)*(byte *)(v0 + 1) << 0x30 |
             (ulong)*(byte *)(v0 + 2) << 0x28 | (ulong)*(byte *)(v0 + 3) << 0x20 |
             (ulong)*(byte *)(v0 + 4) << 0x18 | (ulong)*(byte *)(v0 + 5) << 0x10 |
             (ulong)*(byte *)(v0 + 6) << 8 | (ulong)*(byte *)(v0 + 7)) + v1;
    v1 = (((ulong)*(byte *)v0 << 0x38 | (ulong)*(byte *)(v0 + 1) << 0x30 |
           (ulong)*(byte *)(v0 + 2) << 0x28 | (ulong)*(byte *)(v0 + 3) << 0x20 |
           (ulong)*(byte *)(v0 + 4) << 0x18 | (ulong)*(byte *)(v0 + 5) << 0x10 |
           (ulong)*(byte *)(v0 + 6) << 8 | (ulong)*(byte *)(v0 + 7)) +
         (uVar3 << 0x21 | uVar3 >> 0x1f)) * -0x445c05ea4ddeec5;
    uVar3 = ((ulong)*(byte *)(v0 + 8) << 0x38 | (ulong)*(byte *)(v0 + 9) << 0x30 |
             (ulong)*(byte *)(v0 + 10) << 0x28 | (ulong)*(byte *)(v0 + 0xb) << 0x20 |
             (ulong)*(byte *)(v0 + 0xc) << 0x18 | (ulong)*(byte *)(v0 + 0xd) << 0x10 |
             (ulong)*(byte *)(v0 + 0xe) << 8 | (ulong)*(byte *)(v0 + 0xf)) + v2;
    v2 = (((ulong)*(byte *)(v0 + 8) << 0x38 | (ulong)*(byte *)(v0 + 9) << 0x30 |
           (ulong)*(byte *)(v0 + 10) << 0x28 | (ulong)*(byte *)(v0 + 0xb) << 0x20 |
           (ulong)*(byte *)(v0 + 0xc) << 0x18 | (ulong)*(byte *)(v0 + 0xd) << 0x10 |
           (ulong)*(byte *)(v0 + 0xe) << 8 | (ulong)*(byte *)(v0 + 0xf)) +
         (uVar3 << 0x21 | uVar3 >> 0x1f)) * -0x445c05ea4ddeec5;
    uVar3 = ((ulong)*(byte *)(v0 + 0x10) << 0x38 | (ulong)*(byte *)(v0 + 0x11) << 0x30 |
             (ulong)*(byte *)(v0 + 0x12) << 0x28 | (ulong)*(byte *)(v0 + 0x13) << 0x20 |
             (ulong)*(byte *)(v0 + 0x14) << 0x18 | (ulong)*(byte *)(v0 + 0x15) << 0x10 |
             (ulong)*(byte *)(v0 + 0x16) << 8 | (ulong)*(byte *)(v0 + 0x17)) + v3;
    v3 = (((ulong)*(byte *)(v0 + 0x10) << 0x38 | (ulong)*(byte *)(v0 + 0x11) << 0x30 |
           (ulong)*(byte *)(v0 + 0x12) << 0x28 | (ulong)*(byte *)(v0 + 0x13) << 0x20 |
           (ulong)*(byte *)(v0 + 0x14) << 0x18 | (ulong)*(byte *)(v0 + 0x15) << 0x10 |
           (ulong)*(byte *)(v0 + 0x16) << 8 | (ulong)*(byte *)(v0 + 0x17)) +
         (uVar3 << 0x21 | uVar3 >> 0x1f)) * -0x445c05ea4ddeec5;
    uVar3 = ((ulong)*(byte *)(v0 + 0x18) << 0x38 | (ulong)*(byte *)(v0 + 0x19) << 0x30 |
             (ulong)*(byte *)(v0 + 0x1a) << 0x28 | (ulong)*(byte *)(v0 + 0x1b) << 0x20 |
             (ulong)*(byte *)(v0 + 0x1c) << 0x18 | (ulong)*(byte *)(v0 + 0x1d) << 0x10 |
             (ulong)*(byte *)(v0 + 0x1e) << 8 | (ulong)*(byte *)(v0 + 0x1f)) + i;
    i = (((ulong)*(byte *)(v0 + 0x18) << 0x38 | (ulong)*(byte *)(v0 + 0x19) << 0x30 |
          (ulong)*(byte *)(v0 + 0x1a) << 0x28 | (ulong)*(byte *)(v0 + 0x1b) << 0x20 |
          (ulong)*(byte *)(v0 + 0x1c) << 0x18 | (ulong)*(byte *)(v0 + 0x1d) << 0x10 |
          (ulong)*(byte *)(v0 + 0x1e) << 8 | (ulong)*(byte *)(v0 + 0x1f)) +
        (uVar3 << 0x21 | uVar3 >> 0x1f)) * -0x445c05ea4ddeec5;
    v0 = v0 + 0x20;
  }
  uVar2 = (uint)len;
  uVar1 = uVar2 & 0x18;
  if (uVar1 != 8) {
    if (uVar1 != 0x10) {
      if (uVar1 != 0x18) goto LAB_001483f6;
      uVar3 = ((ulong)*(byte *)(v0 + 0x10) << 0x38 | (ulong)*(byte *)(v0 + 0x11) << 0x30 |
               (ulong)*(byte *)(v0 + 0x12) << 0x28 | (ulong)*(byte *)(v0 + 0x13) << 0x20 |
               (ulong)*(byte *)(v0 + 0x14) << 0x18 | (ulong)*(byte *)(v0 + 0x15) << 0x10 |
               (ulong)*(byte *)(v0 + 0x16) << 8 | (ulong)*(byte *)(v0 + 0x17)) + v3;
      v3 = (((ulong)*(byte *)(v0 + 0x10) << 0x38 | (ulong)*(byte *)(v0 + 0x11) << 0x30 |
             (ulong)*(byte *)(v0 + 0x12) << 0x28 | (ulong)*(byte *)(v0 + 0x13) << 0x20 |
             (ulong)*(byte *)(v0 + 0x14) << 0x18 | (ulong)*(byte *)(v0 + 0x15) << 0x10 |
             (ulong)*(byte *)(v0 + 0x16) << 8 | (ulong)*(byte *)(v0 + 0x17)) +
           (uVar3 << 0x21 | uVar3 >> 0x1f)) * -0x445c05ea4ddeec5;
    }
    uVar3 = ((ulong)*(byte *)(v0 + 8) << 0x38 | (ulong)*(byte *)(v0 + 9) << 0x30 |
             (ulong)*(byte *)(v0 + 10) << 0x28 | (ulong)*(byte *)(v0 + 0xb) << 0x20 |
             (ulong)*(byte *)(v0 + 0xc) << 0x18 | (ulong)*(byte *)(v0 + 0xd) << 0x10 |
             (ulong)*(byte *)(v0 + 0xe) << 8 | (ulong)*(byte *)(v0 + 0xf)) + v2;
    v2 = (((ulong)*(byte *)(v0 + 8) << 0x38 | (ulong)*(byte *)(v0 + 9) << 0x30 |
           (ulong)*(byte *)(v0 + 10) << 0x28 | (ulong)*(byte *)(v0 + 0xb) << 0x20 |
           (ulong)*(byte *)(v0 + 0xc) << 0x18 | (ulong)*(byte *)(v0 + 0xd) << 0x10 |
           (ulong)*(byte *)(v0 + 0xe) << 8 | (ulong)*(byte *)(v0 + 0xf)) +
         (uVar3 << 0x21 | uVar3 >> 0x1f)) * -0x445c05ea4ddeec5;
  }
  uVar3 = ((ulong)*(byte *)v0 << 0x38 | (ulong)*(byte *)(v0 + 1) << 0x30 |
           (ulong)*(byte *)(v0 + 2) << 0x28 | (ulong)*(byte *)(v0 + 3) << 0x20 |
           (ulong)*(byte *)(v0 + 4) << 0x18 | (ulong)*(byte *)(v0 + 5) << 0x10 |
           (ulong)*(byte *)(v0 + 6) << 8 | (ulong)*(byte *)(v0 + 7)) + v1;
  v1 = (((ulong)*(byte *)v0 << 0x38 | (ulong)*(byte *)(v0 + 1) << 0x30 |
         (ulong)*(byte *)(v0 + 2) << 0x28 | (ulong)*(byte *)(v0 + 3) << 0x20 |
         (ulong)*(byte *)(v0 + 4) << 0x18 | (ulong)*(byte *)(v0 + 5) << 0x10 |
         (ulong)*(byte *)(v0 + 6) << 8 | (ulong)*(byte *)(v0 + 7)) + (uVar3 << 0x21 | uVar3 >> 0x1f)
       ) * -0x445c05ea4ddeec5;
  v0 = (len & 0x18) + v0;
LAB_001483f6:
  result = 0;
  switch(uVar2 & 7) {
  case 7:
    result = (ulong)*(byte *)(v0 + 6) << 8;
  case 6:
    result = (ulong)*(byte *)(v0 + 5) << 0x10 | result;
  case 5:
    result = (ulong)*(byte *)(v0 + 4) << 0x18 | result;
  case 4:
    result = (ulong)*(byte *)(v0 + 3) << 0x20 | result;
  case 3:
    result = (ulong)*(byte *)(v0 + 2) << 0x28 | result;
  case 2:
    result = (ulong)*(byte *)(v0 + 1) << 0x30 | result;
  case 1:
    uVar3 = result | (ulong)*(byte *)v0 << 0x38;
    switch(uVar2 >> 3 & 3) {
    case 0:
      v1 = (uVar3 + (uVar3 + v1 << 0x21 | uVar3 + v1 >> 0x1f)) * -0x445c05ea4ddeec5;
      break;
    case 1:
      v2 = (uVar3 + (uVar3 + v2 << 0x21 | uVar3 + v2 >> 0x1f)) * -0x445c05ea4ddeec5;
      break;
    case 2:
      v3 = (uVar3 + (uVar3 + v3 << 0x21 | uVar3 + v3 >> 0x1f)) * -0x445c05ea4ddeec5;
      break;
    case 3:
      i = (uVar3 + (uVar3 + i << 0x21 | uVar3 + i >> 0x1f)) * -0x445c05ea4ddeec5;
    }
  default:
    uVar3 = v1 * -0x54ec8bc667d47937 +
            (len << 0x21 ^ len) +
            (v1 << 0x11 | v1 >> 0x2f) + (v2 << 0xd | v2 >> 0x33) + (v3 << 0x2f | v3 >> 0x11) +
            (i << 0x39 | i >> 7);
    uVar3 = v2 * -0x54ec8bc667d47937 + ((uVar3 * 0x2000 | uVar3 >> 0x33) ^ uVar3);
    uVar3 = v3 * -0x54ec8bc667d47937 + ((uVar3 * 0x20000000 | uVar3 >> 0x23) ^ uVar3);
    uVar3 = i * -0x54ec8bc667d47937 + ((uVar3 << 0x21 | uVar3 >> 0x1f) ^ uVar3);
    uVar3 = (uVar3 << 0x33 | uVar3 >> 0xd) ^ uVar3;
    return (uVar3 >> 0x1d) * -0x445c05ea4ddeec5 ^ uVar3;
  }
}

Assistant:

FIO_FUNC inline uint64_t fio_risky_hash(const void *data_, size_t len,
                                        uint64_t seed) {
  /* reading position */
  const uint8_t *data = (uint8_t *)data_;

  /* The consumption vectors initialized state */
  register uint64_t v0 = seed ^ RISKY_PRIME_1;
  register uint64_t v1 = ~seed + RISKY_PRIME_1;
  register uint64_t v2 =
      fio_lrot64(seed, 17) ^ ((~RISKY_PRIME_1) + RISKY_PRIME_0);
  register uint64_t v3 = fio_lrot64(seed, 33) + (~RISKY_PRIME_1);

  /* consume 256 bit blocks */
  for (size_t i = len >> 5; i; --i) {
    fio_risky_consume(v0, fio_str2u64(data));
    fio_risky_consume(v1, fio_str2u64(data + 8));
    fio_risky_consume(v2, fio_str2u64(data + 16));
    fio_risky_consume(v3, fio_str2u64(data + 24));
    data += 32;
  }

  /* Consume any remaining 64 bit words. */
  switch (len & 24) {
  case 24:
    fio_risky_consume(v2, fio_str2u64(data + 16));
    /* fallthrough */
  case 16:
    fio_risky_consume(v1, fio_str2u64(data + 8));
    /* fallthrough */
  case 8:
    fio_risky_consume(v0, fio_str2u64(data));
    data += len & 24;
  }

  uint64_t tmp = 0;
  /* consume leftover bytes, if any */
  switch ((len & 7)) {
  case 7:
    tmp |= ((uint64_t)data[6]) << 8;
    /* fallthrough */
  case 6:
    tmp |= ((uint64_t)data[5]) << 16;
    /* fallthrough */
  case 5:
    tmp |= ((uint64_t)data[4]) << 24;
    /* fallthrough */
  case 4:
    tmp |= ((uint64_t)data[3]) << 32;
    /* fallthrough */
  case 3:
    tmp |= ((uint64_t)data[2]) << 40;
    /* fallthrough */
  case 2:
    tmp |= ((uint64_t)data[1]) << 48;
    /* fallthrough */
  case 1:
    tmp |= ((uint64_t)data[0]) << 56;
    /* ((len >> 3) & 3) is a 0...3 value indicating consumption vector */
    switch ((len >> 3) & 3) {
    case 3:
      fio_risky_consume(v3, tmp);
      break;
    case 2:
      fio_risky_consume(v2, tmp);
      break;
    case 1:
      fio_risky_consume(v1, tmp);
      break;
    case 0:
      fio_risky_consume(v0, tmp);
      break;
    }
  }

  /* merge and mix */
  uint64_t result = fio_lrot64(v0, 17) + fio_lrot64(v1, 13) +
                    fio_lrot64(v2, 47) + fio_lrot64(v3, 57);

  len ^= (len << 33);
  result += len;

  result += v0 * RISKY_PRIME_1;
  result ^= fio_lrot64(result, 13);
  result += v1 * RISKY_PRIME_1;
  result ^= fio_lrot64(result, 29);
  result += v2 * RISKY_PRIME_1;
  result ^= fio_lrot64(result, 33);
  result += v3 * RISKY_PRIME_1;
  result ^= fio_lrot64(result, 51);

  /* irreversible avalanche... I think */
  result ^= (result >> 29) * RISKY_PRIME_0;
  return result;
}